

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_modifier(Parser *parser)

{
  uint uVar1;
  List *modifiers;
  Modifier *modifier;
  void *pvVar2;
  Token *data;
  
  data = parser->token;
  modifiers = new_list();
  while ((uVar1 = data->kind - PUBLIC, uVar1 < 0xe && ((0x2017U >> (uVar1 & 0x1f) & 1) != 0))) {
    list_add(modifiers,data);
    bmove(parser);
    data = parser->token;
  }
  modifier = new_modifier(modifiers);
  pvVar2 = parse_id(parser,modifier);
  return pvVar2;
}

Assistant:

void *parse_modifier(Parser *parser) {
    Token *tok = token(parser);
    List *modifiers = new_list();
    while (is_modifier(tok)) {
        list_add(modifiers, tok);
        bmove(parser);
        tok = token(parser);
    }
    return parse_id(parser, new_modifier(modifiers));
}